

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_unbind(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA *in_RSI;
  int in_stack_0000000c;
  AFFECT_DATA *af;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  pCVar4 = (CHAR_DATA *)
           check_bind(in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (pCVar4 == (CHAR_DATA *)0x0) {
    pCVar4 = (CHAR_DATA *)
             check_bind((CHAR_DATA *)0x0,
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (pCVar4 == (CHAR_DATA *)0x0) {
      pCVar4 = (CHAR_DATA *)
               check_bind((CHAR_DATA *)0x0,
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (pCVar4 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_RSI,(CHAR_DATA *)0x0);
      }
      else {
        iVar1 = number_percent();
        iVar2 = get_curr_stat((CHAR_DATA *)af,in_stack_0000000c);
        iVar2 = iVar2 * 3;
        iVar3 = get_curr_stat((CHAR_DATA *)af,in_stack_0000000c);
        if (iVar1 < iVar2 + iVar3 * 3) {
          act((char *)in_RSI,pCVar4,
              (void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (void *)CONCAT44(iVar1,iVar2),0);
          act((char *)in_RSI,pCVar4,
              (void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (void *)CONCAT44(iVar1,iVar2),0);
          iVar1 = (int)((ulong)pCVar4 >> 0x20);
          affect_remove(ch,(AFFECT_DATA *)argument);
        }
        else {
          act((char *)in_RSI,pCVar4,
              (void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (void *)CONCAT44(iVar1,iVar2),0);
          act((char *)in_RSI,pCVar4,
              (void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (void *)CONCAT44(iVar1,iVar2),0);
          iVar1 = (int)((ulong)pCVar4 >> 0x20);
        }
        WAIT_STATE(in_RSI,iVar1);
      }
    }
    else {
      iVar1 = number_percent();
      iVar2 = get_curr_stat((CHAR_DATA *)af,in_stack_0000000c);
      if (SBORROW4(iVar1,iVar2 * 6) == iVar1 + iVar2 * -6 < 0) {
        act((char *)in_RSI,pCVar4,(void *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
            (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
        act((char *)in_RSI,pCVar4,(void *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
            (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
        iVar1 = (int)((ulong)pCVar4 >> 0x20);
      }
      else {
        act((char *)in_RSI,pCVar4,(void *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
            (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
        act((char *)in_RSI,pCVar4,(void *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
            (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
        iVar1 = (int)((ulong)pCVar4 >> 0x20);
        affect_remove(ch,(AFFECT_DATA *)argument);
      }
      WAIT_STATE(in_RSI,iVar1);
    }
  }
  else {
    iVar1 = number_percent();
    iVar2 = get_curr_stat((CHAR_DATA *)af,in_stack_0000000c);
    if (SBORROW4(iVar1,iVar2 * 6) == iVar1 + iVar2 * -6 < 0) {
      act((char *)in_RSI,pCVar4,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      act((char *)in_RSI,pCVar4,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      iVar1 = (int)((ulong)pCVar4 >> 0x20);
    }
    else {
      act((char *)in_RSI,pCVar4,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      act((char *)in_RSI,pCVar4,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
          (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      iVar1 = (int)((ulong)pCVar4 >> 0x20);
      affect_remove(ch,(AFFECT_DATA *)argument);
    }
    WAIT_STATE(in_RSI,iVar1);
  }
  return;
}

Assistant:

void do_unbind(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA *af = check_bind(ch, "arms");

	if (af != nullptr)
	{
		if (number_percent() < get_curr_stat(ch, STAT_STR) * 6)
		{
			act("Exerting all of your strength, you break the bindings on your arms!", ch, 0, 0, TO_CHAR);
			act("Exerting all of $s strength, $n breaks the bindings on $s arms!", ch, 0, 0, TO_ROOM);
			affect_remove(ch, af);
		}
		else
		{
			act("You struggle with the bindings on your arms, but fail to break them.", ch, 0, 0, TO_CHAR);
			act("$n struggles with the bindings on $s arms, but fails to break them.", ch, 0, 0, TO_ROOM);
		}

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}
	else if ((af = check_bind(ch, "head")) != nullptr)
	{
		if (number_percent() < get_curr_stat(ch, STAT_DEX) * 6)
		{
			act("Staggering blindly, you manage to rip the sack off your head!", ch, 0, 0, TO_CHAR);
			act("Staggering blindly, $n manages to rip the sack off $s head!", ch, 0, 0, TO_ROOM);
			affect_remove(ch, af);
		}
		else
		{
			act("You struggle with the sack on your head, but fail to remove it.", ch, 0, 0, TO_CHAR);
			act("$n struggles with the sack on $s head, but fails to remove it.", ch, 0, 0, TO_ROOM);
		}

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}
	else if ((af = check_bind(ch, "legs")) != nullptr)
	{
		if (number_percent() < (get_curr_stat(ch, STAT_DEX) * 3 + get_curr_stat(ch, STAT_STR) * 3))
		{
			act("You pull the bindings on your legs, ripping them apart!", ch, 0, 0, TO_CHAR);
			act("$n pulls the bindings on $s legs, ripping them apart!", ch, 0, 0, TO_ROOM);
			affect_remove(ch, af);
		}
		else
		{
			act("You struggle with the bindings on your legs, but fail to break them.", ch, 0, 0, TO_CHAR);
			act("$n struggles with the bindings on $s legs, but fails to break them.", ch, 0, 0, TO_ROOM);
		}

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}
	else
	{
		send_to_char("You are not bound.\n\r", ch);
	}
}